

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O0

int ARKodeSetEpsLin(void *arkode_mem,sunrealtype eplifac)

{
  ARKodeMem in_RDI;
  double in_XMM0_Qa;
  int retval;
  ARKLsMem arkls_mem;
  ARKodeMem ark_mem;
  ARKLsMem *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  ARKodeMem in_stack_ffffffffffffffd8;
  int local_4;
  
  if (in_RDI == (ARKodeMem)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,0x297,"ARKodeSetEpsLin",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                    ,"arkode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if (in_RDI->step_supports_implicit == 0) {
    arkProcessError(in_RDI,-0x30,0x2a0,"ARKodeSetEpsLin",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                    ,"time-stepping module does not require an algebraic solver");
    local_4 = -0x30;
  }
  else {
    local_4 = arkLs_AccessLMem(in_stack_ffffffffffffffd8,
                               (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
                               ,in_stack_ffffffffffffffc8);
    if (local_4 == 0) {
      if (in_XMM0_Qa <= 0.0) {
        in_XMM0_Qa = 0.05;
      }
      in_stack_ffffffffffffffd8->Sabstol = in_XMM0_Qa;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int ARKodeSetEpsLin(void* arkode_mem, sunrealtype eplifac)
{
  ARKodeMem ark_mem;
  ARKLsMem arkls_mem;
  int retval;

  /* Return immediately if arkode_mem is NULL */
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Guard against use for time steppers that do not need an algebraic solver */
  if (!ark_mem->step_supports_implicit)
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not require an algebraic solver");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  /* access ARKLsMem structure */
  retval = arkLs_AccessLMem(ark_mem, __func__, &arkls_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* store input and return */
  arkls_mem->eplifac = (eplifac <= ZERO) ? ARKLS_EPLIN : eplifac;

  return (ARKLS_SUCCESS);
}